

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_loop_join_inner.cpp
# Opt level: O1

idx_t duckdb::RefineNestedLoopJoin::Operation<duckdb::interval_t,duckdb::LessThanEquals>
                (Vector *left,Vector *right,idx_t left_size,idx_t right_size,idx_t *lpos,idx_t *rpos
                ,SelectionVector *lvector,SelectionVector *rvector,idx_t current_match_count)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  bool bVar17;
  UnifiedVectorFormat right_data;
  UnifiedVectorFormat left_data;
  idx_t local_108;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat(left,left_size,&local_78);
  Vector::ToUnifiedFormat(right,right_size,&local_c0);
  if (current_match_count == 0) {
    local_108 = 0;
  }
  else {
    psVar1 = lvector->sel_vector;
    psVar2 = rvector->sel_vector;
    psVar3 = (local_78.sel)->sel_vector;
    psVar4 = (local_c0.sel)->sel_vector;
    local_108 = 0;
    uVar14 = 0;
    do {
      uVar13 = uVar14;
      if (psVar1 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar1[uVar14];
      }
      uVar12 = uVar14;
      if (psVar2 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar2[uVar14];
      }
      uVar9 = uVar13;
      if (psVar3 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar3[uVar13];
      }
      uVar5 = uVar12;
      if (psVar4 != (sel_t *)0x0) {
        uVar5 = (ulong)psVar4[uVar12];
      }
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        bVar16 = false;
      }
      else {
        bVar16 = (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0;
      }
      if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        bVar17 = false;
      }
      else {
        bVar17 = (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [uVar5 >> 6] >> (uVar5 & 0x3f) & 1) == 0;
      }
      if (!bVar16 && !bVar17) {
        lVar10 = uVar9 * 0x10;
        lVar6 = uVar5 * 0x10;
        lVar7 = (long)*(int *)(local_78.data + lVar10 + 4) +
                *(long *)(local_78.data + lVar10 + 8) / 86400000000;
        lVar15 = lVar7 % 0x1e;
        lVar11 = (long)*(int *)(local_78.data + lVar10) + lVar7 / 0x1e;
        lVar8 = (long)*(int *)(local_c0.data + lVar6 + 4) +
                *(long *)(local_c0.data + lVar6 + 8) / 86400000000;
        lVar7 = lVar8 % 0x1e;
        lVar8 = (long)*(int *)(local_c0.data + lVar6) + lVar8 / 0x1e;
        if ((lVar11 <= lVar8) &&
           ((lVar11 < lVar8 ||
            ((lVar15 <= lVar7 &&
             ((lVar15 < lVar7 ||
              (*(long *)(local_78.data + lVar10 + 8) % 86400000000 <=
               *(long *)(local_c0.data + lVar6 + 8) % 86400000000)))))))) {
          psVar1[local_108] = (sel_t)uVar13;
          psVar2[local_108] = (sel_t)uVar12;
          local_108 = local_108 + 1;
        }
      }
      uVar14 = uVar14 + 1;
    } while (current_match_count != uVar14);
  }
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return local_108;
}

Assistant:

static idx_t Operation(Vector &left, Vector &right, idx_t left_size, idx_t right_size, idx_t &lpos, idx_t &rpos,
	                       SelectionVector &lvector, SelectionVector &rvector, idx_t current_match_count) {
		using MATCH_OP = ComparisonOperationWrapper<OP>;

		UnifiedVectorFormat left_data, right_data;
		left.ToUnifiedFormat(left_size, left_data);
		right.ToUnifiedFormat(right_size, right_data);

		// refine phase of the nested loop join
		// refine lvector and rvector based on matches of subsequent conditions (in case there are multiple conditions
		// in the join)
		D_ASSERT(current_match_count > 0);
		auto ldata = UnifiedVectorFormat::GetData<T>(left_data);
		auto rdata = UnifiedVectorFormat::GetData<T>(right_data);
		idx_t result_count = 0;
		for (idx_t i = 0; i < current_match_count; i++) {
			auto lidx = lvector.get_index(i);
			auto ridx = rvector.get_index(i);
			auto left_idx = left_data.sel->get_index(lidx);
			auto right_idx = right_data.sel->get_index(ridx);
			bool left_is_valid = left_data.validity.RowIsValid(left_idx);
			bool right_is_valid = right_data.validity.RowIsValid(right_idx);
			if (MATCH_OP::Operation(ldata[left_idx], rdata[right_idx], !left_is_valid, !right_is_valid)) {
				lvector.set_index(result_count, lidx);
				rvector.set_index(result_count, ridx);
				result_count++;
			}
		}
		return result_count;
	}